

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

uchar hex_value(char c)

{
  ushort **ppuVar1;
  char in_DIL;
  uchar local_1;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[(int)in_DIL] & 0x800) == 0) {
    switch(in_DIL) {
    case 'A':
    case 'a':
      local_1 = '\n';
      break;
    case 'B':
    case 'b':
      local_1 = '\v';
      break;
    case 'C':
    case 'c':
      local_1 = '\f';
      break;
    case 'D':
    case 'd':
      local_1 = '\r';
      break;
    case 'E':
    case 'e':
      local_1 = '\x0e';
      break;
    case 'F':
    case 'f':
      local_1 = '\x0f';
      break;
    default:
      local_1 = 0xff;
    }
  }
  else {
    local_1 = in_DIL + 0xd0;
  }
  return local_1;
}

Assistant:

static unsigned char hex_value (json_char c)
{
   if (isdigit(c))
      return c - '0';

   switch (c) {
      case 'a': case 'A': return 0x0A;
      case 'b': case 'B': return 0x0B;
      case 'c': case 'C': return 0x0C;
      case 'd': case 'D': return 0x0D;
      case 'e': case 'E': return 0x0E;
      case 'f': case 'F': return 0x0F;
      default: return 0xFF;
   }
}